

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O1

int cd_integer_init(parser_info *info,char **attr)

{
  node_info *pnVar1;
  int iVar2;
  coda_type_number *pcVar3;
  int iVar4;
  
  iVar2 = handle_format_attribute_for_type(info,attr);
  iVar4 = -1;
  if (iVar2 == 0) {
    pnVar1 = info->node;
    pnVar1->free_data = coda_type_release;
    pcVar3 = coda_type_number_new(pnVar1->format,coda_integer_class);
    info->node->data = pcVar3;
    if (pcVar3 != (coda_type_number *)0x0) {
      iVar2 = handle_name_attribute_for_type(info,attr);
      if (iVar2 == 0) {
        pnVar1 = info->node;
        pnVar1->init_sub_element[0xb] = string_data_init;
        pnVar1->add_element_to_parent[0xb] = type_set_description;
        pnVar1 = info->node;
        pnVar1->init_sub_element[0x29] = string_data_init;
        pnVar1->add_element_to_parent[0x29] = cd_integer_set_unit;
        pnVar1 = info->node;
        pnVar1->init_sub_element[8] = integer_constant_or_expression_init;
        pnVar1->add_element_to_parent[8] = type_set_byte_size;
        pnVar1 = info->node;
        pnVar1->init_sub_element[7] = integer_constant_or_expression_init;
        pnVar1->add_element_to_parent[7] = type_set_bit_size;
        pnVar1 = info->node;
        pnVar1->init_sub_element[0x15] = dummy_init;
        pnVar1->add_element_to_parent[0x15] = cd_integer_set_little_endian;
        pnVar1 = info->node;
        pnVar1->init_sub_element[0x1c] = cd_native_type_init;
        pnVar1->add_element_to_parent[0x1c] = cd_integer_set_read_type;
        pnVar1 = info->node;
        pnVar1->init_sub_element[10] = cd_conversion_init;
        pnVar1->add_element_to_parent[10] = cd_integer_set_conversion;
        pnVar1 = info->node;
        pnVar1->init_sub_element[0x16] = cd_mapping_init;
        pnVar1->add_element_to_parent[0x16] = cd_integer_add_mapping;
        pnVar1 = info->node;
        pnVar1->init_sub_element[4] = cd_attribute_init;
        pnVar1->add_element_to_parent[4] = type_add_attribute;
        info->node->finalise_element = cd_integer_finalise;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

static int cd_integer_init(parser_info *info, const char **attr)
{
    if (handle_format_attribute_for_type(info, attr) != 0)
    {
        return -1;
    }
    info->node->free_data = (free_data_handler)coda_type_release;
    info->node->data = coda_type_number_new(info->node->format, coda_integer_class);
    if (info->node->data == NULL)
    {
        return -1;
    }
    if (handle_name_attribute_for_type(info, attr) != 0)
    {
        return -1;
    }

    register_sub_element(info->node, element_cd_description, string_data_init, type_set_description);
    register_sub_element(info->node, element_cd_unit, string_data_init, cd_integer_set_unit);
    register_sub_element(info->node, element_cd_byte_size, integer_constant_or_expression_init, type_set_byte_size);
    register_sub_element(info->node, element_cd_bit_size, integer_constant_or_expression_init, type_set_bit_size);
    register_sub_element(info->node, element_cd_little_endian, dummy_init, cd_integer_set_little_endian);
    register_sub_element(info->node, element_cd_native_type, cd_native_type_init, cd_integer_set_read_type);
    register_sub_element(info->node, element_cd_conversion, cd_conversion_init, cd_integer_set_conversion);
    register_sub_element(info->node, element_cd_mapping, cd_mapping_init, cd_integer_add_mapping);
    register_sub_element(info->node, element_cd_attribute, cd_attribute_init, type_add_attribute);
    info->node->finalise_element = cd_integer_finalise;

    return 0;
}